

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O3

int unzClose(unzFile file)

{
  if (file != (unzFile)0x0) {
    if (*(long *)((long)file + 0x140) != 0) {
      unzCloseCurrentFile(file);
    }
    (**(code **)((long)file + 0x28))
              (*(undefined8 *)((long)file + 0x38),*(undefined8 *)((long)file + 0x60));
    free(file);
    return 0;
  }
  return -0x66;
}

Assistant:

extern int ZEXPORT unzClose(unzFile file)
{
    unz64_s* s;
    if (file == NULL)
        return UNZ_PARAMERROR;
    s = (unz64_s*)file;

    if (s->pfile_in_zip_read != NULL)
        unzCloseCurrentFile(file);

    ZCLOSE64(s->z_filefunc, s->filestream);
    TRYFREE(s);
    return UNZ_OK;
}